

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::internal::MapFieldPrinterHelper::CopyKey
               (MapKey *key,Message *message,FieldDescriptor *field_desc)

{
  Reflection *this;
  Reflection *field;
  FieldDescriptor *message_00;
  bool value;
  CppType CVar1;
  int32_t value_00;
  uint32_t value_01;
  LogMessage *pLVar2;
  int64_t value_02;
  uint64_t value_03;
  allocator<char> local_89;
  string_view local_88;
  string local_78;
  LogMessage local_40;
  Voidify local_29;
  Reflection *local_28;
  Reflection *reflection;
  FieldDescriptor *field_desc_local;
  Message *message_local;
  MapKey *key_local;
  
  reflection = (Reflection *)field_desc;
  field_desc_local = (FieldDescriptor *)message;
  message_local = (Message *)key;
  local_28 = Message::GetReflection(message);
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)reflection);
  message_00 = field_desc_local;
  field = reflection;
  this = local_28;
  switch(CVar1) {
  case CPPTYPE_INT32:
    value_00 = MapKey::GetInt32Value((MapKey *)message_local);
    Reflection::SetInt32(this,(Message *)message_00,(FieldDescriptor *)field,value_00);
    break;
  case CPPTYPE_INT64:
    value_02 = MapKey::GetInt64Value((MapKey *)message_local);
    Reflection::SetInt64(this,(Message *)message_00,(FieldDescriptor *)field,value_02);
    break;
  case CPPTYPE_UINT32:
    value_01 = MapKey::GetUInt32Value((MapKey *)message_local);
    Reflection::SetUInt32(this,(Message *)message_00,(FieldDescriptor *)field,value_01);
    break;
  case CPPTYPE_UINT64:
    value_03 = MapKey::GetUInt64Value((MapKey *)message_local);
    Reflection::SetUInt64(this,(Message *)message_00,(FieldDescriptor *)field,value_03);
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x9db);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [15])"Not supported.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_40);
    break;
  case CPPTYPE_BOOL:
    value = MapKey::GetBoolValue((MapKey *)message_local);
    Reflection::SetBool(this,(Message *)message_00,(FieldDescriptor *)field,value);
    break;
  case CPPTYPE_STRING:
    local_88 = MapKey::GetStringValue((MapKey *)message_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_78,&local_88,&local_89);
    Reflection::SetString(this,(Message *)message_00,(FieldDescriptor *)field,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_89);
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyKey(const MapKey& key, Message* message,
                                    const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      ABSL_LOG(ERROR) << "Not supported.";
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc,
                            std::string(key.GetStringValue()));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, key.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, key.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, key.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, key.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, key.GetBoolValue());
      return;
  }
}